

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  string makefileName_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string makefileName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string makefileName;
  undefined1 local_58 [8];
  string generator;
  string *target_local;
  string *makefile_local;
  string *make_local;
  cmExtraSublimeTextGenerator *this_local;
  string *command;
  
  generator.field_2._M_local_buf[0xf] = '\0';
  generator.field_2._M_local_buf[0xe] = '\"';
  generator.field_2._M_local_buf[0xd] = '\"';
  cmStrCat<char,std::__cxx11::string_const&,char>
            (__return_storage_ptr__,generator.field_2._M_local_buf + 0xe,make,
             generator.field_2._M_local_buf + 0xd);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath((string *)local_88,makefile);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"/NOLOGO\", \"/f\", \"");
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),", \"",target);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(makefileName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath((string *)local_108,makefile);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),", \"",target);
      std::operator+(&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)(makefileName_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_108);
    }
    else {
      std::__cxx11::string::string((string *)local_188);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_188,(string *)makefile);
      }
      else {
        cmSystemTools::ConvertToOutputPath(&local_1a8,makefile);
        std::__cxx11::string::operator=((string *)local_188,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::operator+(&local_208,", \"",target);
      std::operator+(&local_1e8,&local_208,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)local_188);
    }
  }
  generator.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_58);
  if ((generator.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}